

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.h
# Opt level: O2

void __thiscall FeatureSet::~FeatureSet(FeatureSet *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->ages).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            ((_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)this);
  return;
}

Assistant:

int size(){
        return points.size();
    }